

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O1

void __thiscall
actorpp::detail::ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::push
          (ChannelImpl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *item)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device =
       &((this->actor_impl).
         super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mut;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  std::
  deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->elements,item);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void push(T &&item) {
    std::unique_lock<std::mutex> lock(actor_impl->mut);
    elements.push(std::move(item));
    actor_impl->cv.notify_one();
  }